

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O0

int PixarLogEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  uint uVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  char *local_78;
  uint16_t *local_60;
  unsigned_short *up;
  ulong uStack_50;
  int llen;
  tmsize_t n;
  tmsize_t i;
  PixarLogState *sp;
  TIFFDirectory *td;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *bp_local;
  TIFF *tif_local;
  
  puVar3 = tif->tif_data;
  uVar1 = *(uint *)(puVar3 + 0x108);
  uStack_50 = cc;
  if (1 < uVar1) {
    if (uVar1 - 2 < 3) {
      uStack_50 = (ulong)cc >> 1;
    }
    else {
      if (uVar1 != 5) {
        TIFFErrorExtR(tif,"PixarLogEncode","%u bit input not supported in PixarLog",
                      (ulong)(tif->tif_dir).td_bitspersample);
        return 0;
      }
      uStack_50 = (ulong)cc >> 2;
    }
  }
  iVar4 = (uint)*(ushort *)(puVar3 + 0x100) * (tif->tif_dir).td_imagewidth;
  if ((long)((ulong)(tif->tif_dir).td_rowsperstrip * (long)iVar4) < (long)uStack_50) {
    TIFFErrorExtR(tif,"PixarLogEncode","Too many input bytes provided");
    tif_local._4_4_ = 0;
  }
  else {
    n = 0;
    local_60 = *(uint16_t **)(puVar3 + 0xf8);
    cc_local = (tmsize_t)bp;
    for (; n < (long)uStack_50; n = iVar4 + n) {
      iVar2 = *(int *)(puVar3 + 0x108);
      if (iVar2 == 0) {
        horizontalDifference8
                  ((uchar *)cc_local,iVar4,(uint)*(ushort *)(puVar3 + 0x100),local_60,
                   *(uint16_t **)(puVar3 + 0x148));
        cc_local = iVar4 + cc_local;
      }
      else if (iVar2 == 4) {
        horizontalDifference16
                  ((unsigned_short *)cc_local,iVar4,(uint)*(ushort *)(puVar3 + 0x100),local_60,
                   *(uint16_t **)(puVar3 + 0x140));
        cc_local = (long)iVar4 * 2 + cc_local;
      }
      else {
        if (iVar2 != 5) {
          TIFFErrorExtR(tif,"PixarLogEncode","%u bit input not supported in PixarLog",
                        (ulong)(tif->tif_dir).td_bitspersample);
          return 0;
        }
        horizontalDifferenceF
                  ((float *)cc_local,iVar4,(uint)*(ushort *)(puVar3 + 0x100),local_60,
                   *(uint16_t **)(puVar3 + 0x138));
        cc_local = (long)iVar4 * 4 + cc_local;
      }
      local_60 = local_60 + iVar4;
    }
    *(undefined8 *)(puVar3 + 0x80) = *(undefined8 *)(puVar3 + 0xf8);
    *(int *)(puVar3 + 0x88) = (int)(uStack_50 << 1);
    if ((ulong)(*(uint *)(puVar3 + 0x88) >> 1) == (uStack_50 & 0xffffffff)) {
      do {
        iVar4 = deflate((z_streamp)(puVar3 + 0x80),0);
        if (iVar4 != 0) {
          if (*(long *)(puVar3 + 0xb0) == 0) {
            local_78 = "(null)";
          }
          else {
            local_78 = *(char **)(puVar3 + 0xb0);
          }
          TIFFErrorExtR(tif,"PixarLogEncode","Encoder error: %s",local_78);
          return 0;
        }
        if (*(int *)(puVar3 + 0xa0) == 0) {
          tif->tif_rawcc = tif->tif_rawdatasize;
          iVar4 = TIFFFlushData1(tif);
          if (iVar4 == 0) {
            return 0;
          }
          *(uint8_t **)(puVar3 + 0x98) = tif->tif_rawdata;
          *(int *)(puVar3 + 0xa0) = (int)tif->tif_rawdatasize;
        }
      } while (*(int *)(puVar3 + 0x88) != 0);
      tif_local._4_4_ = 1;
    }
    else {
      TIFFErrorExtR(tif,"PixarLogEncode","ZLib cannot deal with buffers this size");
      tif_local._4_4_ = 0;
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int PixarLogEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "PixarLogEncode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = EncoderState(tif);
    tmsize_t i;
    tmsize_t n;
    int llen;
    unsigned short *up;

    (void)s;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            n = cc / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            n = cc / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            n = cc;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;
    /* Check against the number of elements (of size uint16_t) of sp->tbuf */
    if (n > ((tmsize_t)td->td_rowsperstrip * llen))
    {
        TIFFErrorExtR(tif, module, "Too many input bytes provided");
        return 0;
    }

    for (i = 0, up = sp->tbuf; i < n; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalDifferenceF((float *)bp, llen, sp->stride, up,
                                      sp->FromLT2);
                bp += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalDifference16((uint16_t *)bp, llen, sp->stride, up,
                                       sp->From14);
                bp += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalDifference8((unsigned char *)bp, llen, sp->stride, up,
                                      sp->From8);
                bp += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module,
                              "%" PRIu16 " bit input not supported in PixarLog",
                              td->td_bitspersample);
                return 0;
        }
    }

    sp->stream.next_in = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_in) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_in = (uInt)(n * sizeof(uint16_t));
    if ((sp->stream.avail_in / sizeof(uint16_t)) != (uInt)n)
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }

    do
    {
        if (deflate(&sp->stream, Z_NO_FLUSH) != Z_OK)
        {
            TIFFErrorExtR(tif, module, "Encoder error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (sp->stream.avail_out == 0)
        {
            tif->tif_rawcc = tif->tif_rawdatasize;
            if (!TIFFFlushData1(tif))
                return 0;
            sp->stream.next_out = tif->tif_rawdata;
            sp->stream.avail_out =
                (uInt)tif
                    ->tif_rawdatasize; /* this is a safe typecast, as check is
                                          made already in PixarLogPreEncode */
        }
    } while (sp->stream.avail_in > 0);
    return (1);
}